

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::FuncCaseBase::FuncCaseBase
          (FuncCaseBase *this,Context *context,string *name,FuncBase *func)

{
  string local_48;
  FuncBase *local_28;
  FuncBase *func_local;
  string *name_local;
  Context *context_local;
  FuncCaseBase *this_local;
  
  local_28 = func;
  func_local = (FuncBase *)name;
  name_local = &context->name;
  context_local = (Context *)this;
  (*func->_vptr_FuncBase[3])();
  PrecisionCase::PrecisionCase(&this->super_PrecisionCase,context,name,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_PrecisionCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FuncCaseBase_032d14a0;
  return;
}

Assistant:

FuncCaseBase	(const Context&		context,
									 const string&		name,
									 const FuncBase&	func)
						: PrecisionCase	(context, name, func.getRequiredExtension()) {}